

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

void __thiscall QPDFJob::AttConfig::AttConfig(AttConfig *this,Config *c)

{
  this->config = c;
  AddAttachment::AddAttachment(&this->att);
  return;
}

Assistant:

QPDFJob::AttConfig::AttConfig(Config* c) :
    config(c)
{
}